

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.h
# Opt level: O1

void __thiscall XPMP2::InetAddrTy::CopyFrom(InetAddrTy *this,SockAddrTy *sa)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  if (*(char *)&sa->field_0 == '\n') {
    uVar1 = *(uint32_t *)((long)&sa->field_0 + 8);
    uVar2 = *(uint32_t *)((long)&sa->field_0 + 0xc);
    uVar3 = *(uint32_t *)((long)&sa->field_0 + 0x10);
    uVar4 = *(uint32_t *)((long)&sa->field_0 + 0x14);
  }
  else {
    if (*(char *)&sa->field_0 == '\x02') {
      (this->field_0).addr[0] = (sa->field_0).sa_in.sin_addr.s_addr;
      (this->field_0).addr[3] = 0;
      *(undefined8 *)((long)&this->field_0 + 4) = 0;
      return;
    }
    uVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
  }
  (this->field_0).addr[0] = uVar1;
  (this->field_0).addr[1] = uVar2;
  (this->field_0).addr[2] = uVar3;
  (this->field_0).addr[3] = uVar4;
  return;
}

Assistant:

bool isIp4() const { return family() == AF_INET; }